

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O1

void __thiscall
Transcript::AddWeights(Transcript *this,vector<double,_std::allocator<double>_> *weights)

{
  length_error *this_00;
  long *plVar1;
  size_type *psVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  string local_a0;
  string local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  if ((long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start >> 3 ==
      (long)(((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1)) {
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->super_Polymer).polymerases_.weights_,weights);
    std::vector<double,_std::allocator<double>_>::operator=(&this->weights_,weights);
    return;
  }
  this_00 = (length_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string
            (&local_80,
             (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish -
             (long)(weights->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 3);
  std::operator+(&local_60,"Provided weights not the correct size. ",&local_80);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_60);
  local_c0._M_dataplus._M_p = (pointer)*plVar1;
  psVar2 = (size_type *)(plVar1 + 2);
  if ((size_type *)local_c0._M_dataplus._M_p == psVar2) {
    local_c0.field_2._M_allocated_capacity = *psVar2;
    local_c0.field_2._8_8_ = plVar1[3];
    local_c0._M_dataplus._M_p = (pointer)&local_c0.field_2;
  }
  else {
    local_c0.field_2._M_allocated_capacity = *psVar2;
  }
  local_c0._M_string_length = plVar1[1];
  *plVar1 = (long)psVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__cxx11::to_string
            (&local_a0,((this->super_Polymer).stop_ - (this->super_Polymer).start_) + 1);
  std::operator+(&local_40,&local_c0,&local_a0);
  std::length_error::length_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::length_error::typeinfo,std::length_error::~length_error);
}

Assistant:

void Transcript::AddWeights(const std::vector<double> &weights) {
  if (weights.size() != (stop_ - start_ + 1)) { //start_ should always be 1
    throw std::length_error("Provided weights not the correct size. " +
                            std::to_string(weights.size()) + " " +
                            std::to_string(stop_ - start_ + 1));
  }
  polymerases_.set_weights(weights);
  weights_ = weights;
}